

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O1

void start_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  byte bVar5;
  size_t sVar6;
  long lVar7;
  bmp_dest_ptr dest;
  int map_colors;
  bool bVar8;
  undefined4 uStack_48;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined4 uStack_40;
  undefined2 uStack_38;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined2 uStack_32;
  undefined2 uStack_30;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined2 uStack_2c;
  
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  if (*(int *)&dinfo[1].start_output == 0) {
    write_bmp_header(cinfo,(bmp_dest_ptr)dinfo);
    return;
  }
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar8 = cinfo->quantize_colors == 0;
    bVar4 = !bVar8;
    bVar5 = bVar8 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    bVar5 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        bVar5 = 8;
      }
    }
  }
  uVar2 = cinfo->output_height;
  lVar7 = (ulong)*(uint *)((long)&dinfo[1].finish_output + 4) * (ulong)uVar2 +
          (ulong)(uint)(map_colors * 3) + 0x1a;
  uStack_32 = 0;
  uStack_30 = 0;
  uStack_38 = 0x4d42;
  uStack_36 = (undefined1)lVar7;
  uStack_35 = (undefined1)((ulong)lVar7 >> 8);
  uStack_34 = (undefined1)((ulong)lVar7 >> 0x10);
  uStack_33 = (undefined1)((ulong)lVar7 >> 0x18);
  uStack_2e = 0x1a;
  uStack_2d = (undefined1)((uint)(map_colors * 3) >> 8);
  uStack_2c = 0;
  _uStack_48 = CONCAT17((char)(uVar2 >> 8),
                        CONCAT16((char)uVar2,
                                 CONCAT15((char)(cinfo->output_width >> 8),
                                          CONCAT14((char)cinfo->output_width,0xc))));
  uStack_40 = (uint)CONCAT12(bVar5,1);
  sVar6 = fwrite(&uStack_38,1,0xe,(FILE *)dinfo->output_file);
  if (sVar6 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar6 = fwrite(&uStack_48,1,0xc,(FILE *)dinfo->output_file);
  if (sVar6 != 0xc) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,(bmp_dest_ptr)dinfo,map_colors,3);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;

  if (!dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);
  }
}